

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * read_file(string *__return_storage_ptr__,path *path)

{
  int iVar1;
  value_type *pvVar2;
  ContextManager *pCVar3;
  ssize_t sVar4;
  string local_98;
  string local_78;
  int local_54;
  undefined1 local_4d;
  int cnt;
  string local_40;
  int local_1c;
  path *ppStack_18;
  fd_t fd;
  path *path_local;
  string *res;
  
  ppStack_18 = path;
  path_local = (path *)__return_storage_ptr__;
  pvVar2 = std::filesystem::__cxx11::path::c_str(path);
  local_1c = open(pvVar2,0);
  if (local_1c < 0) {
    pCVar3 = ContextManager::get();
    pvVar2 = std::filesystem::__cxx11::path::c_str(ppStack_18);
    format_abi_cxx11_(&local_40,"Cannot open file \'%s\' for reading: %m",pvVar2);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  local_4d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    sVar4 = read(local_1c,(anonymous_namespace)::read_buf,0x7ff);
    local_54 = (int)sVar4;
    if (local_54 < 0) {
      pCVar3 = ContextManager::get();
      pvVar2 = std::filesystem::__cxx11::path::c_str(ppStack_18);
      format_abi_cxx11_(&local_78,"Cannot read from file \'%s\': %m",pvVar2);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    if (local_54 == 0) break;
    (anonymous_namespace)::read_buf[local_54] = 0;
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(anonymous_namespace)::read_buf);
  }
  iVar1 = close(local_1c);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    pvVar2 = std::filesystem::__cxx11::path::c_str(ppStack_18);
    format_abi_cxx11_(&local_98,"Cannot close file \'%s\': %m",pvVar2);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_file(const fs::path &path) {
    fd_t fd = open(path.c_str(), O_RDONLY);
    if (fd < 0) {
        die(format("Cannot open file '%s' for reading: %m", path.c_str()));
    }

    std::string res;
    while (true) {
        int cnt = read(fd, read_buf, READ_BUF_SIZE - 1);
        if (cnt < 0) {
            die(format("Cannot read from file '%s': %m", path.c_str()));
        }
        if (cnt == 0) break;
        read_buf[cnt] = 0;
        res += read_buf;
    }

    if (close(fd) != 0) {
        die(format("Cannot close file '%s': %m", path.c_str()));
    }
    return res;
}